

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

string * __thiscall
Vault::Tiny<Vault::SecretVersionDetail,long>::toString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long *plVar1;
  ostringstream local_190 [8];
  ostringstream ss;
  Tiny<Vault::SecretVersionDetail,_long> *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  plVar1 = Tiny<Vault::SecretVersionDetail,_long>::value
                     ((Tiny<Vault::SecretVersionDetail,_long> *)this);
  std::ostream::operator<<((ostream *)local_190,*plVar1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string toString() const {
    std::ostringstream ss;
    ss << value();
    return ss.str();
  }